

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Parser::ParseIncDec(Parser *this)

{
  pointer pSVar1;
  SymbolList *pSVar2;
  bool bVar3;
  bool bVar4;
  RuntimeID RVar5;
  mapped_type *pmVar6;
  char *args;
  Opcode opcode;
  char *format;
  String varName;
  PropertyName propName;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_110;
  undefined1 local_f0 [16];
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_e0;
  Variant local_c0;
  size_t local_98;
  PropertyName local_90;
  
  if (((this->m_error == false) &&
      (pSVar1 = (this->m_currentSymbol)._M_current,
      pSVar1 != (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish)) && (pSVar1->type == Increment)) {
    this->m_lastLine = pSVar1->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar1 + 1;
    bVar3 = true;
  }
  else {
    bVar3 = false;
    Expect(this,Decrement,(char *)0x0);
  }
  PropertyName::PropertyName(&local_90);
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  bVar4 = CheckProperty(this,(this->m_currentSymbol)._M_current,(size_t *)0x0);
  if (bVar4) {
    ParsePropertyName((PropertyName *)local_f0,this);
    local_90.m_visibility = (VisibilityType)local_f0._8_5_;
    local_90.m_readOnly = SUB51(local_f0._8_5_,4);
    local_90.m_id._0_5_ = (undefined5)CONCAT44(local_f0._4_4_,local_f0._0_4_);
    local_90.m_id._5_3_ = SUB43(local_f0._4_4_,1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              (&local_90.m_name,&local_e0);
    Variant::operator=(&local_90.m_defaultValue,&local_c0);
    local_90.m_partCount = local_98;
    Variant::~Variant(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      MemFree(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_90.m_readOnly == false) {
      EmitOpcode(this,PushProp);
      local_f0._0_4_ = (undefined4)(undefined5)local_90.m_id;
      local_f0._4_4_ = (undefined4)(CONCAT35(local_90.m_id._5_3_,(undefined5)local_90.m_id) >> 0x20)
      ;
      Buffer::Write((this->m_writer).m_buffer.
                    super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    &(this->m_writer).m_pos,local_f0,8);
      local_f0._0_4_ = (undefined4)(undefined5)local_90.m_id;
      local_f0._4_4_ = (undefined4)(CONCAT35(local_90.m_id._5_3_,(undefined5)local_90.m_id) >> 0x20)
      ;
      pmVar6 = std::
               map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
               ::operator[](&this->m_idNameMap,(key_type *)local_f0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
                (pmVar6,&local_90.m_name);
      goto LAB_001256b3;
    }
    format = "Can\'t %s a readonly property";
  }
  else {
    bVar4 = CheckVariable(this,(this->m_currentSymbol)._M_current,(size_t *)0x0);
    if (bVar4) {
      ParseVariable_abi_cxx11_((String *)local_f0,this);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
                (&local_110,
                 (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_f0);
      if ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
          CONCAT44(local_f0._4_4_,local_f0._0_4_) != &local_e0) {
        MemFree((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                CONCAT44(local_f0._4_4_,local_f0._0_4_),(size_t)(local_e0._M_dataplus._M_p + 1));
      }
      EmitOpcode(this,PushVar);
      RVar5 = VariableNameToRuntimeID(this,&local_110);
      local_f0._0_4_ = (undefined4)RVar5;
      local_f0._4_4_ = (undefined4)(RVar5 >> 0x20);
      Buffer::Write((this->m_writer).m_buffer.
                    super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    &(this->m_writer).m_pos,local_f0,8);
LAB_001256b3:
      if (this->m_error == false) {
        pSVar2 = this->m_symbolList;
        pSVar1 = (this->m_currentSymbol)._M_current;
        if ((pSVar1 == (pSVar2->
                       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)
                       ._M_impl.super__Vector_impl_data._M_finish) || (pSVar1->type != By))
        goto LAB_001256f7;
        this->m_lastLine = pSVar1->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar1 + 1;
        ParseExpression(this,(pSVar2->
                             super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
LAB_001256f7:
        EmitOpcode(this,PushVal);
        local_f0._0_4_ = Null;
        Variant::SetInteger((Variant *)local_f0,1);
        Variant::Write((Variant *)local_f0,&this->m_writer);
        Variant::~Variant((Variant *)local_f0);
      }
      opcode = Decrement;
      if (bVar3) {
        opcode = Increment;
      }
      EmitOpcode(this,opcode);
      if (local_90.m_name._M_string_length == 0) {
        EmitOpcode(this,SetVar);
        RVar5 = VariableNameToRuntimeID(this,&local_110);
        local_f0._0_4_ = (undefined4)RVar5;
        local_f0._4_4_ = (undefined4)(RVar5 >> 0x20);
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      &(this->m_writer).m_pos,local_f0,8);
      }
      else {
        EmitOpcode(this,SetProp);
        local_f0._0_4_ = (undefined4)(undefined5)local_90.m_id;
        local_f0._4_4_ =
             (undefined4)(CONCAT35(local_90.m_id._5_3_,(undefined5)local_90.m_id) >> 0x20);
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      &(this->m_writer).m_pos,local_f0,8);
        local_f0._0_4_ = (undefined4)(undefined5)local_90.m_id;
        local_f0._4_4_ =
             (undefined4)(CONCAT35(local_90.m_id._5_3_,(undefined5)local_90.m_id) >> 0x20);
        pmVar6 = std::
                 map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
                 ::operator[](&this->m_idNameMap,(key_type *)local_f0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
                  (pmVar6,&local_90.m_name);
      }
      Expect(this,NewLine,(char *)0x0);
      goto LAB_001254f8;
    }
    format = "Valid property or variable name expected after %s keyword";
  }
  args = "decrement";
  if (bVar3) {
    args = "increment";
  }
  Error<char_const(&)[10]>(this,format,(char (*) [10])args);
LAB_001254f8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    MemFree(local_110._M_dataplus._M_p,
            CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,local_110.field_2._M_local_buf[0]
                    ) + 1);
  }
  Variant::~Variant(&local_90.m_defaultValue);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != &local_90.m_name.field_2) {
    MemFree(local_90.m_name._M_dataplus._M_p,local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline_t void Parser::ParseIncDec()
	{
		bool increment = Accept(SymbolType::Increment);
		if (!increment)
			Expect(SymbolType::Decrement);
		PropertyName propName;
		String varName;
		if (CheckProperty())
		{
			propName = ParsePropertyName();
			if (propName.IsReadOnly())
			{
				Error("Can't %s a readonly property", increment ? "increment" : "decrement");
				return;
			}
			EmitOpcode(Opcode::PushProp);
			EmitId(propName.GetId());
			m_idNameMap[propName.GetId()] = propName.GetName();
		}
		else if (CheckVariable())
		{
			varName = ParseVariable();
			EmitOpcode(Opcode::PushVar);
			EmitId(VariableNameToRuntimeID(varName));
		}
		else
		{
			Error("Valid property or variable name expected after %s keyword", increment ? "increment" : "decrement");
			return;
		}
		if (Accept(SymbolType::By))
		{
			ParseExpression();
		}
		else
		{
			EmitOpcode(Opcode::PushVal);
			EmitValue(1);
		}
		EmitOpcode(increment ? Opcode::Increment : Opcode::Decrement);
		if (!propName.GetName().empty())
		{
			EmitOpcode(Opcode::SetProp);
			EmitId(propName.GetId());
			m_idNameMap[propName.GetId()] = propName.GetName();
		}
		else
		{
			EmitOpcode(Opcode::SetVar);
			EmitId(VariableNameToRuntimeID(varName));
		}
		Expect(SymbolType::NewLine);
	}